

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncTaskManager.hpp
# Opt level: O0

void __thiscall sftm::CAsyncTaskManager::Stop(CAsyncTaskManager *this)

{
  bool bVar1;
  reference pvVar2;
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  uint local_18;
  uint local_14;
  uint32_t nWorker_1;
  uint32_t nWorker;
  CAsyncTaskManager *this_local;
  
  _nWorker_1 = this;
  for (local_14 = 0; local_14 < this->m_nWorkerCount; local_14 = local_14 + 1) {
    pvVar2 = std::array<sftm::CAsyncWorker,_64UL>::operator[](&this->m_workers,(ulong)local_14);
    CAsyncWorker::Stop(pvVar2);
  }
  for (local_18 = 0; local_18 < this->m_nWorkerCount; local_18 = local_18 + 1) {
    while( true ) {
      pvVar2 = std::array<sftm::CAsyncWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
      bVar1 = CAsyncWorker::IsFinished(pvVar2);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_24 = 10;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
      std::condition_variable::notify_all();
    }
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}